

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger base_array(HSQUIRRELVM v)

{
  SQInteger SVar1;
  HSQUIRRELVM in_RDI;
  SQObject *size;
  SQArray *a;
  SQObjectPtr *in_stack_ffffffffffffff88;
  SQSharedState *in_stack_ffffffffffffff90;
  SQInteger in_stack_ffffffffffffff98;
  SQArray *in_stack_ffffffffffffffa0;
  SQObjectPtr local_28;
  SQObjectPtr *local_18;
  SQArray *local_10;
  HSQUIRRELVM local_8;
  
  local_8 = in_RDI;
  local_18 = stack_get((HSQUIRRELVM)in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
  SVar1 = sq_gettop(local_8);
  if (SVar1 < 3) {
    local_10 = SQArray::Create(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
  }
  else {
    local_10 = SQArray::Create(in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
    stack_get((HSQUIRRELVM)in_stack_ffffffffffffff90,(SQInteger)in_stack_ffffffffffffff88);
    SQArray::Resize(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                    (SQObjectPtr *)in_stack_ffffffffffffff90);
  }
  SQObjectPtr::SQObjectPtr(&local_28,local_10);
  SQVM::Push(local_8,in_stack_ffffffffffffff88);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_8);
  return 1;
}

Assistant:

static SQInteger base_array(HSQUIRRELVM v)
{
    SQArray *a;
    SQObject &size = stack_get(v,2);
    if(sq_gettop(v) > 2) {
        a = SQArray::Create(_ss(v),0);
        a->Resize(tointeger(size),stack_get(v,3));
    }
    else {
        a = SQArray::Create(_ss(v),tointeger(size));
    }
    v->Push(a);
    return 1;
}